

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_protocol.cpp
# Opt level: O1

int PackUserCmd(usercmd_t *ucmd,usercmd_t *basis,BYTE **stream)

{
  short sVar1;
  uint uVar2;
  byte *pbVar3;
  BYTE *pBVar4;
  byte bVar5;
  short *psVar6;
  byte bVar7;
  uint uVar8;
  short *psVar9;
  short *psVar10;
  short *psVar11;
  short *psVar12;
  byte bVar13;
  short *psVar14;
  byte bVar15;
  short local_44 [2];
  short local_40 [2];
  short local_3c [6];
  
  pbVar3 = *stream;
  if (basis == (usercmd_t *)0x0) {
    basis = (usercmd_t *)(local_3c + 4);
    local_3c[4] = 0;
    local_3c[5] = 0;
    psVar6 = local_3c;
    local_3c[0] = 0;
    psVar12 = local_3c + 3;
    local_3c[3] = 0;
    psVar14 = local_40;
    local_40[0] = 0;
    psVar11 = local_3c + 2;
    local_3c[2] = 0;
    psVar10 = local_44;
    local_44[0] = 0;
    psVar9 = local_3c + 1;
    local_3c[1] = 0;
  }
  else {
    psVar6 = &basis->pitch;
    psVar12 = &basis->yaw;
    psVar11 = &basis->forwardmove;
    psVar10 = &basis->sidemove;
    psVar9 = &basis->upmove;
    psVar14 = &basis->roll;
  }
  *pbVar3 = 0;
  pBVar4 = *stream;
  *stream = pBVar4 + 1;
  uVar2 = ucmd->buttons;
  if (uVar2 == basis->buttons) {
    bVar7 = 0;
  }
  else {
    uVar8 = basis->buttons ^ uVar2;
    bVar7 = (byte)(uVar2 >> 7);
    bVar13 = bVar7 & 0x7f;
    bVar5 = (byte)(uVar2 >> 0xe) & 0x7f;
    if (uVar8 < 0x80) {
      bVar15 = (byte)uVar2 & 0x7f;
    }
    else {
      bVar15 = (byte)uVar2 | 0x80;
      if (0x3fff < uVar8) {
        bVar13 = bVar7 | 0x80;
        bVar5 = (0x1fffff < uVar8) << 7 | bVar5;
      }
    }
    pBVar4[1] = bVar15;
    pBVar4 = *stream;
    *stream = pBVar4 + 1;
    bVar7 = 1;
    if ((char)bVar15 < '\0') {
      pBVar4[1] = bVar13;
      pBVar4 = *stream;
      *stream = pBVar4 + 1;
      if ((char)bVar13 < '\0') {
        pBVar4[1] = bVar5;
        pBVar4 = *stream;
        *stream = pBVar4 + 1;
        if ((char)bVar5 < '\0') {
          pBVar4[1] = (BYTE)(uVar2 >> 0x15);
          *stream = *stream + 1;
        }
      }
    }
  }
  sVar1 = ucmd->pitch;
  if (sVar1 != *psVar6) {
    bVar7 = bVar7 | 2;
    **stream = (BYTE)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    *stream = *stream + 2;
  }
  sVar1 = ucmd->yaw;
  if (sVar1 != *psVar12) {
    bVar7 = bVar7 | 4;
    **stream = (BYTE)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    *stream = *stream + 2;
  }
  sVar1 = ucmd->forwardmove;
  if (sVar1 != *psVar11) {
    bVar7 = bVar7 | 8;
    **stream = (BYTE)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    *stream = *stream + 2;
  }
  sVar1 = ucmd->sidemove;
  if (sVar1 != *psVar10) {
    bVar7 = bVar7 | 0x10;
    **stream = (BYTE)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    *stream = *stream + 2;
  }
  sVar1 = ucmd->upmove;
  if (sVar1 != *psVar9) {
    bVar7 = bVar7 | 0x20;
    **stream = (BYTE)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    *stream = *stream + 2;
  }
  sVar1 = ucmd->roll;
  if (sVar1 != *psVar14) {
    bVar7 = bVar7 | 0x40;
    **stream = (BYTE)((ushort)sVar1 >> 8);
    (*stream)[1] = (BYTE)sVar1;
    *stream = *stream + 2;
  }
  *pbVar3 = bVar7;
  return *(int *)stream - (int)pbVar3;
}

Assistant:

int PackUserCmd (const usercmd_t *ucmd, const usercmd_t *basis, BYTE **stream)
{
	BYTE flags = 0;
	BYTE *temp = *stream;
	BYTE *start = *stream;
	usercmd_t blank;
	DWORD buttons_changed;

	if (basis == NULL)
	{
		memset (&blank, 0, sizeof(blank));
		basis = &blank;
	}

	WriteByte (0, stream);			// Make room for the packing bits

	buttons_changed = ucmd->buttons ^ basis->buttons;
	if (buttons_changed != 0)
	{
		BYTE bytes[4] = {  BYTE(ucmd->buttons        & 0x7F),
						  BYTE((ucmd->buttons >> 7)  & 0x7F),
						  BYTE((ucmd->buttons >> 14) & 0x7F),
						  BYTE((ucmd->buttons >> 21) & 0xFF) };

		flags |= UCMDF_BUTTONS;

		if (buttons_changed & 0xFFFFFF80)
		{
			bytes[0] |= 0x80;
			if (buttons_changed & 0xFFFFC000)
			{
				bytes[1] |= 0x80;
				if (buttons_changed & 0xFFE00000)
				{
					bytes[2] |= 0x80;
				}
			}
		}
		WriteByte (bytes[0], stream);
		if (bytes[0] & 0x80)
		{
			WriteByte (bytes[1], stream);
			if (bytes[1] & 0x80)
			{
				WriteByte (bytes[2], stream);
				if (bytes[2] & 0x80)
				{
					WriteByte (bytes[3], stream);
				}
			}
		}
	}
	if (ucmd->pitch != basis->pitch)
	{
		flags |= UCMDF_PITCH;
		WriteWord (ucmd->pitch, stream);
	}
	if (ucmd->yaw != basis->yaw)
	{
		flags |= UCMDF_YAW;
		WriteWord (ucmd->yaw, stream);
	}
	if (ucmd->forwardmove != basis->forwardmove)
	{
		flags |= UCMDF_FORWARDMOVE;
		WriteWord (ucmd->forwardmove, stream);
	}
	if (ucmd->sidemove != basis->sidemove)
	{
		flags |= UCMDF_SIDEMOVE;
		WriteWord (ucmd->sidemove, stream);
	}
	if (ucmd->upmove != basis->upmove)
	{
		flags |= UCMDF_UPMOVE;
		WriteWord (ucmd->upmove, stream);
	}
	if (ucmd->roll != basis->roll)
	{
		flags |= UCMDF_ROLL;
		WriteWord (ucmd->roll, stream);
	}

	// Write the packing bits
	WriteByte (flags, &temp);

	return int(*stream - start);
}